

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O0

void __thiscall
QTextDocumentLayoutPrivate::drawBlock
          (QTextDocumentLayoutPrivate *this,QPointF *offset,QPainter *painter,PaintContext *context,
          QTextBlock *bl,bool inRootFrame)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Style SVar8;
  PaintContext *context_00;
  QDebug *pQVar9;
  long lVar10;
  qsizetype qVar11;
  QTextObject *pQVar12;
  QColor *x1pos;
  QTextDocumentLayoutPrivate *in_RCX;
  QRectF *in_RDX;
  long in_RDI;
  QPointF *in_R8;
  byte in_R9B;
  long in_FS_OFFSET;
  qreal qVar13;
  qreal qVar14;
  QTextLine QVar15;
  QTextLength QVar16;
  qreal middleX;
  qreal y;
  qreal width;
  int cpos;
  QTextObject *object;
  int selEnd;
  int selStart;
  Selection *range;
  int i;
  QTextCharFormat *selFormat;
  int bllen;
  int blpos;
  QTextFrameData *fd;
  QTextLayout *tl;
  QPen oldPen;
  QTextLine l;
  QList<QTextLayout::FormatRange> selections;
  QRectF rect;
  QBrush bg;
  QRectF r;
  QColor color;
  FormatRange o_1;
  FormatRange o;
  QTextBlockFormat blockFormat;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  ColorRole in_stack_fffffffffffffc08;
  ColorGroup in_stack_fffffffffffffc0c;
  Iterator *in_stack_fffffffffffffc10;
  QRectF *in_stack_fffffffffffffc18;
  QTextFormat *in_stack_fffffffffffffc20;
  QTextFormat *in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc34;
  byte in_stack_fffffffffffffc35;
  byte in_stack_fffffffffffffc36;
  undefined1 in_stack_fffffffffffffc37;
  byte bVar17;
  QPainter *in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc5c;
  uint position;
  QTextDocumentLayoutPrivate *this_00;
  QTextLayout *in_stack_fffffffffffffc68;
  bool local_389;
  int in_stack_fffffffffffffcfc;
  QRectF *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  int iVar18;
  QPointF *pos;
  QTextFrameData *in_stack_fffffffffffffd20;
  undefined7 in_stack_fffffffffffffd30;
  QTextLength local_278 [2];
  QRectF local_250;
  undefined1 *local_230;
  undefined1 *local_228;
  QTextEngine *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  QRectF local_200;
  QPointF in_stack_fffffffffffffe20;
  QFixed local_1c4;
  QSizeF local_1c0;
  QRectF local_1b0;
  undefined4 local_18c;
  undefined1 *local_188;
  QDebug local_140;
  QDebug local_138;
  QDebug local_130;
  QDebug local_128;
  QDebug local_120;
  QPointF local_118;
  QPointF local_108;
  QRectF local_f8;
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined8 local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_R9B & 1;
  context_00 = (PaintContext *)QTextBlock::layout((QTextBlock *)in_stack_fffffffffffffc18);
  local_f8.xp = -NAN;
  local_f8.yp = -NAN;
  local_f8.w = -NAN;
  local_f8.h = -NAN;
  QTextLayout::boundingRect(in_stack_fffffffffffffc68);
  local_118 = QTextLayout::position((QTextLayout *)in_stack_fffffffffffffc18);
  local_108 = ::operator+((QPointF *)in_stack_fffffffffffffc18,(QPointF *)in_stack_fffffffffffffc10)
  ;
  QRectF::translate((QRectF *)in_stack_fffffffffffffc10,
                    (QPointF *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
  bVar2 = QTextBlock::isVisible((QTextBlock *)in_stack_fffffffffffffc18);
  if (!bVar2) goto LAB_00800745;
  bVar2 = QRectF::isValid((QRectF *)&(in_RCX->super_QAbstractTextDocumentLayoutPrivate).field_0x18);
  if (bVar2) {
    qVar14 = QRectF::bottom(&local_f8);
    qVar13 = QRectF::y((QRectF *)&(in_RCX->super_QAbstractTextDocumentLayoutPrivate).field_0x18);
    if (qVar14 < qVar13) goto LAB_00800745;
    qVar14 = QRectF::top(&local_f8);
    qVar13 = QRectF::bottom((QRectF *)&(in_RCX->super_QAbstractTextDocumentLayoutPrivate).field_0x18
                           );
    if (qVar13 < qVar14) goto LAB_00800745;
  }
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  lcDraw();
  anon_unknown.dwarf_13b8fb2::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffffc10,
             (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
  while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_38), bVar2) {
    anon_unknown.dwarf_13b8fb2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x7ff8e8);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18,
               (int)((ulong)in_stack_fffffffffffffc10 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
               (char *)0x7ff901);
    QMessageLogger::debug();
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffc28,
                       (char *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    QTextBlock::position
              ((QTextBlock *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c);
    pQVar9 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffc28,
                                (char *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58
                                                ));
    QDebug::QDebug(&local_138,pQVar9);
    ::operator<<((Stream *)&local_130,(QPointF *)&local_138);
    pQVar9 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffc28,
                                (char *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58
                                                ));
    QDebug::QDebug(&local_128,pQVar9);
    QTextLayout::boundingRect(in_stack_fffffffffffffc68);
    ::operator<<((Stream *)&local_120,(QRectF *)&local_128);
    QDebug::~QDebug(&local_120);
    QDebug::~QDebug(&local_128);
    QDebug::~QDebug(&local_130);
    QDebug::~QDebug(&local_138);
    QDebug::~QDebug(&local_140);
    local_30 = (undefined1 *)((ulong)local_30 & 0xffffffffffffff00);
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::blockFormat((QTextBlock *)in_stack_fffffffffffffc20);
  local_188 = &DAT_aaaaaaaaaaaaaaaa;
  QTextFormat::background
            ((QTextFormat *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
  local_18c = 0;
  bVar2 = ::operator!=((QBrush *)in_stack_fffffffffffffc10,
                       (BrushStyle *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
  if (bVar2) {
    local_1b0.xp = local_f8.xp;
    local_1b0.yp = local_f8.yp;
    local_1b0.w = local_f8.w;
    local_1b0.h = local_f8.h;
    bVar2 = false;
    if ((bVar1 & 1) != 0) {
      local_1c0 = QTextDocument::pageSize((QTextDocument *)in_stack_fffffffffffffc18);
      qVar14 = QSizeF::width(&local_1c0);
      bVar2 = qVar14 <= 0.0;
    }
    if (bVar2) {
      QTextDocument::rootFrame((QTextDocument *)in_stack_fffffffffffffc10);
      in_stack_fffffffffffffd20 = ::data((QTextFrame *)in_stack_fffffffffffffc10);
      local_1c4 = QFixed::operator-((QFixed *)
                                    CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                                    (int)in_stack_fffffffffffffc10);
      qVar14 = QFixed::toReal(&local_1c4);
      QRectF::setRight(&local_1b0,qVar14);
    }
    bVar2 = QTextFormat::hasProperty
                      (in_stack_fffffffffffffc20,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20));
    if (!bVar2) {
      QBrush::QBrush((QBrush *)in_stack_fffffffffffffc10,
                     (QBrush *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
      in_stack_fffffffffffffe20 = QRectF::topLeft(in_stack_fffffffffffffc18);
      QRectF::QRectF(&local_200);
      fillBackground(in_stack_fffffffffffffc38,
                     (QRectF *)
                     CONCAT17(in_stack_fffffffffffffc37,
                              CONCAT16(in_stack_fffffffffffffc36,
                                       CONCAT15(in_stack_fffffffffffffc35,
                                                CONCAT14(in_stack_fffffffffffffc34,
                                                         in_stack_fffffffffffffc30)))),
                     (QBrush *)in_stack_fffffffffffffc28,(QPointF *)in_stack_fffffffffffffc20,
                     in_stack_fffffffffffffc18);
      QBrush::~QBrush((QBrush *)0x7ffca5);
    }
  }
  local_218 = &DAT_aaaaaaaaaaaaaaaa;
  local_210 = &DAT_aaaaaaaaaaaaaaaa;
  local_208 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QTextLayout::FormatRange>::QList((QList<QTextLayout::FormatRange> *)0x7ffce1);
  iVar4 = QTextBlock::position
                    ((QTextBlock *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
  iVar5 = QTextBlock::length((QTextBlock *)
                             CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
  pos = (QPointF *)0x0;
  for (iVar18 = 0; lVar10 = (long)iVar18,
      qVar11 = QList<QAbstractTextDocumentLayout::Selection>::size
                         ((QList<QAbstractTextDocumentLayout::Selection> *)
                          &(in_RCX->super_QAbstractTextDocumentLayoutPrivate).field_0x38),
      iVar6 = in_stack_fffffffffffffe20.yp._4_4_, lVar10 < qVar11; iVar18 = iVar18 + 1) {
    in_stack_fffffffffffffd00 =
         (QRectF *)
         QList<QAbstractTextDocumentLayout::Selection>::at
                   ((QList<QAbstractTextDocumentLayout::Selection> *)in_stack_fffffffffffffc10,
                    CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
    in_stack_fffffffffffffcfc =
         QTextCursor::selectionStart((QTextCursor *)in_stack_fffffffffffffc18);
    in_stack_fffffffffffffcfc = in_stack_fffffffffffffcfc - iVar4;
    iVar6 = QTextCursor::selectionEnd((QTextCursor *)in_stack_fffffffffffffc18);
    iVar6 = iVar6 - iVar4;
    if (((in_stack_fffffffffffffcfc < iVar5) && (0 < iVar6)) && (in_stack_fffffffffffffcfc < iVar6))
    {
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      local_50 = &DAT_aaaaaaaaaaaaaaaa;
      QTextLayout::FormatRange::FormatRange((FormatRange *)0x7ffe2e);
      local_60 = (undefined1 *)CONCAT44(iVar6 - in_stack_fffffffffffffcfc,in_stack_fffffffffffffcfc)
      ;
      QTextCharFormat::operator=
                ((QTextCharFormat *)in_stack_fffffffffffffc10,
                 (QTextCharFormat *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
      QList<QTextLayout::FormatRange>::append
                ((QList<QTextLayout::FormatRange> *)in_stack_fffffffffffffc10,
                 (parameter_type)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
      QTextLayout::FormatRange::~FormatRange((FormatRange *)0x7ffe90);
    }
    else {
      bVar2 = QTextCursor::hasSelection((QTextCursor *)in_stack_fffffffffffffc20);
      if ((!bVar2) &&
         (bVar2 = QTextFormat::hasProperty
                            (in_stack_fffffffffffffc20,
                             (int)((ulong)in_stack_fffffffffffffc18 >> 0x20)), bVar2)) {
        QTextCursor::position
                  ((QTextCursor *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        bVar2 = QTextBlock::contains
                          ((QTextBlock *)in_stack_fffffffffffffc28,
                           (int)((ulong)in_stack_fffffffffffffc20 >> 0x20));
        if (bVar2) {
          local_78 = &DAT_aaaaaaaaaaaaaaaa;
          local_70 = &DAT_aaaaaaaaaaaaaaaa;
          local_68 = &DAT_aaaaaaaaaaaaaaaa;
          QTextLayout::FormatRange::FormatRange((FormatRange *)0x7fff32);
          local_228 = &DAT_aaaaaaaaaaaaaaaa;
          local_220 = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
          QTextCursor::position
                    ((QTextCursor *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
          QVar15 = QTextLayout::lineForTextPosition
                             ((QTextLayout *)in_stack_fffffffffffffc28,
                              (int)((ulong)in_stack_fffffffffffffc20 >> 0x20));
          local_220 = QVar15.eng;
          local_228 = (undefined1 *)CONCAT44(local_228._4_4_,QVar15.index);
          iVar7 = QTextLine::textStart((QTextLine *)0x7fff99);
          local_78 = (undefined1 *)CONCAT44(local_78._4_4_,iVar7);
          iVar7 = QTextLine::textLength((QTextLine *)in_stack_fffffffffffffc28);
          if ((int)local_78 + iVar7 == iVar5 + -1) {
            iVar7 = iVar7 + 1;
          }
          local_78 = (undefined1 *)CONCAT44(iVar7,(int)local_78);
          QTextCharFormat::operator=
                    ((QTextCharFormat *)in_stack_fffffffffffffc10,
                     (QTextCharFormat *)
                     CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
          QList<QTextLayout::FormatRange>::append
                    ((QList<QTextLayout::FormatRange> *)in_stack_fffffffffffffc10,
                     (parameter_type)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
          QTextLayout::FormatRange::~FormatRange((FormatRange *)0x800020);
        }
      }
    }
    if ((in_stack_fffffffffffffcfc < 0) && (0 < iVar6)) {
      pos = (QPointF *)&in_stack_fffffffffffffd00->yp;
    }
  }
  this_00 = *(QTextDocumentLayoutPrivate **)(in_RDI + 0x88);
  QTextBlock::blockFormat((QTextBlock *)in_stack_fffffffffffffc20);
  pQVar12 = QTextDocument::objectForFormat
                      ((QTextDocument *)in_stack_fffffffffffffc10,
                       (QTextFormat *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08))
  ;
  QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x8000af);
  local_389 = false;
  if (pQVar12 != (QTextObject *)0x0) {
    QTextObject::format((QTextObject *)in_stack_fffffffffffffc18);
    QTextFormat::toListFormat
              ((QTextFormat *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
    SVar8 = QTextListFormat::style((QTextListFormat *)0x800127);
    local_389 = SVar8 != ListStyleUndefined;
  }
  position = CONCAT13(local_389,(int3)in_stack_fffffffffffffc5c);
  if (pQVar12 != (QTextObject *)0x0) {
    QTextListFormat::~QTextListFormat((QTextListFormat *)0x800152);
    QTextFormat::~QTextFormat((QTextFormat *)0x80016b);
  }
  if ((position & 0x1000000) != 0) {
    drawListItem(in_RCX,in_R8,(QPainter *)CONCAT17(bVar1,in_stack_fffffffffffffd30),context_00,
                 (QTextBlock *)in_stack_fffffffffffffd20,(QTextCharFormat *)CONCAT44(iVar4,iVar5));
  }
  local_230 = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::pen((QPainter *)in_stack_fffffffffffffc10);
  QPen::QPen((QPen *)in_stack_fffffffffffffc10,
             (QPen *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
  QPalette::color((QPalette *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c);
  QPainter::setPen((QPainter *)in_stack_fffffffffffffc18,(QColor *)in_stack_fffffffffffffc10);
  bVar2 = QRectF::isValid((QRectF *)&(in_RCX->super_QAbstractTextDocumentLayoutPrivate).field_0x18);
  if (bVar2) {
    QRectF::operator&(&local_250,
                      (QRectF *)&(in_RCX->super_QAbstractTextDocumentLayoutPrivate).field_0x18);
  }
  else {
    local_250.xp = *(qreal *)(in_RDI + 0xd8);
    local_250.yp = *(qreal *)(in_RDI + 0xe0);
    local_250.w = *(qreal *)(in_RDI + 0xe8);
    local_250.h = *(qreal *)(in_RDI + 0xf0);
  }
  QTextLayout::draw((QTextLayout *)in_stack_fffffffffffffd20,(QPainter *)CONCAT44(iVar4,iVar5),pos,
                    (QList<QTextLayout::FormatRange> *)CONCAT44(iVar18,in_stack_fffffffffffffd08),
                    in_stack_fffffffffffffd00);
  frameIteratorForTextPosition(this_00,position);
  bVar3 = isEmptyBlockBeforeTable(in_stack_fffffffffffffc10);
  bVar2 = false;
  bVar1 = 0;
  if ((!bVar3) &&
     ((*(int *)&in_RCX->super_QAbstractTextDocumentLayoutPrivate < iVar4 ||
      (in_stack_fffffffffffffc36 = 1, bVar1 = 1,
      iVar4 + iVar5 <= *(int *)&in_RCX->super_QAbstractTextDocumentLayoutPrivate)))) {
    in_stack_fffffffffffffc35 = 0;
    bVar2 = *(int *)&in_RCX->super_QAbstractTextDocumentLayoutPrivate < -1;
    in_stack_fffffffffffffc36 = in_stack_fffffffffffffc35;
    bVar1 = in_stack_fffffffffffffc35;
    if (bVar2) {
      QTextLayout::preeditAreaText
                ((QTextLayout *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
      bVar3 = QString::isEmpty((QString *)0x80038a);
      in_stack_fffffffffffffc35 = bVar3 ^ 0xff;
      in_stack_fffffffffffffc36 = in_stack_fffffffffffffc35;
      bVar1 = in_stack_fffffffffffffc35;
    }
  }
  bVar17 = bVar1;
  if (bVar2) {
    QString::~QString((QString *)0x8003c1);
  }
  if ((bVar1 & 1) != 0) {
    if (*(int *)&in_RCX->super_QAbstractTextDocumentLayoutPrivate < -1) {
      QTextLayout::preeditAreaPosition((QTextLayout *)0x8003f6);
    }
    QTextLayout::drawCursor
              ((QTextLayout *)pos,(QPainter *)CONCAT44(iVar18,in_stack_fffffffffffffd08),
               (QPointF *)in_stack_fffffffffffffd00,iVar6,in_stack_fffffffffffffcfc);
  }
  bVar2 = QTextFormat::hasProperty
                    (in_stack_fffffffffffffc20,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20));
  if (bVar2) {
    QVar16 = QTextFormat::lengthProperty
                       (in_stack_fffffffffffffc28,(int)((ulong)in_stack_fffffffffffffc20 >> 0x20));
    local_278[0].fixedValueOrPercentage = QVar16.fixedValueOrPercentage;
    local_278[0].lengthType = QVar16.lengthType;
    qVar14 = QRectF::width(&local_f8);
    QTextLength::value(local_278,qVar14);
    local_d8 = &DAT_aaaaaaaaaaaaaaaa;
    local_d0 = &DAT_aaaaaaaaaaaaaaaa;
    bVar2 = QTextFormat::hasProperty
                      (in_stack_fffffffffffffc20,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20));
    if (bVar2) {
      QTextFormat::property
                (in_stack_fffffffffffffc28,(int)((ulong)in_stack_fffffffffffffc20 >> 0x20));
      qvariant_cast<QBrush>((QVariant *)in_stack_fffffffffffffc28);
      x1pos = QBrush::color((QBrush *)0x800547);
    }
    else {
      x1pos = QPalette::color((QPalette *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c,
                              in_stack_fffffffffffffc08);
    }
    local_d8 = *(undefined1 **)x1pos;
    local_d0 = *(undefined1 **)((long)&x1pos->ct + 4);
    if (bVar2) {
      QBrush::~QBrush((QBrush *)0x8005a0);
      ::QVariant::~QVariant(&local_28);
    }
    QPainter::setPen((QPainter *)in_stack_fffffffffffffc18,(QColor *)in_stack_fffffffffffffc10);
    QRectF::bottom(&local_f8);
    iVar4 = QTextBlock::length((QTextBlock *)
                               CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
    if (iVar4 == 1) {
      in_stack_fffffffffffffc20 = (QTextFormat *)QRectF::top(&local_f8);
      QRectF::height(&local_f8);
    }
    in_stack_fffffffffffffc10 = (Iterator *)QRectF::left(&local_f8);
    QRectF::width(&local_f8);
    QLineF::QLineF((QLineF *)
                   CONCAT17(bVar17,CONCAT16(in_stack_fffffffffffffc36,
                                            CONCAT15(in_stack_fffffffffffffc35,
                                                     CONCAT14(bVar1,in_stack_fffffffffffffc30)))),
                   (qreal)x1pos,(qreal)in_stack_fffffffffffffc20,(qreal)in_RDX,
                   (qreal)in_stack_fffffffffffffc10);
    QPainter::drawLine((QPainter *)in_stack_fffffffffffffc10,
                       (QLineF *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
    in_stack_fffffffffffffc18 = in_RDX;
  }
  QPainter::setPen((QPainter *)in_stack_fffffffffffffc18,(QPen *)in_stack_fffffffffffffc10);
  QPen::~QPen((QPen *)0x80071e);
  QList<QTextLayout::FormatRange>::~QList((QList<QTextLayout::FormatRange> *)0x80072b);
  QBrush::~QBrush((QBrush *)0x800738);
  QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x800745);
LAB_00800745:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentLayoutPrivate::drawBlock(const QPointF &offset, QPainter *painter,
                                           const QAbstractTextDocumentLayout::PaintContext &context,
                                           const QTextBlock &bl, bool inRootFrame) const
{
    const QTextLayout *tl = bl.layout();
    QRectF r = tl->boundingRect();
    r.translate(offset + tl->position());
    if (!bl.isVisible() || (context.clip.isValid() && (r.bottom() < context.clip.y() || r.top() > context.clip.bottom())))
        return;
    qCDebug(lcDraw) << "drawBlock" << bl.position() << "at" << offset << "br" << tl->boundingRect();

    QTextBlockFormat blockFormat = bl.blockFormat();

    QBrush bg = blockFormat.background();
    if (bg != Qt::NoBrush) {
        QRectF rect = r;

        // extend the background rectangle if we're in the root frame with NoWrap,
        // as the rect of the text block will then be only the width of the text
        // instead of the full page width
        if (inRootFrame && document->pageSize().width() <= 0) {
            const QTextFrameData *fd = data(document->rootFrame());
            rect.setRight((fd->size.width - fd->rightMargin).toReal());
        }

        // in the case of <hr>, the background-color CSS style fills only the rule's thickness instead of the whole line
        if (!blockFormat.hasProperty(QTextFormat::BlockTrailingHorizontalRulerWidth))
            fillBackground(painter, rect, bg, r.topLeft());
    }

    QList<QTextLayout::FormatRange> selections;
    int blpos = bl.position();
    int bllen = bl.length();
    const QTextCharFormat *selFormat = nullptr;
    for (int i = 0; i < context.selections.size(); ++i) {
        const QAbstractTextDocumentLayout::Selection &range = context.selections.at(i);
        const int selStart = range.cursor.selectionStart() - blpos;
        const int selEnd = range.cursor.selectionEnd() - blpos;
        if (selStart < bllen && selEnd > 0
             && selEnd > selStart) {
            QTextLayout::FormatRange o;
            o.start = selStart;
            o.length = selEnd - selStart;
            o.format = range.format;
            selections.append(o);
        } else if (! range.cursor.hasSelection() && range.format.hasProperty(QTextFormat::FullWidthSelection)
                   && bl.contains(range.cursor.position())) {
            // for full width selections we don't require an actual selection, just
            // a position to specify the line. that's more convenience in usage.
            QTextLayout::FormatRange o;
            QTextLine l = tl->lineForTextPosition(range.cursor.position() - blpos);
            o.start = l.textStart();
            o.length = l.textLength();
            if (o.start + o.length == bllen - 1)
                ++o.length; // include newline
            o.format = range.format;
            selections.append(o);
       }
        if (selStart < 0 && selEnd >= 1)
            selFormat = &range.format;
    }

    QTextObject *object = document->objectForFormat(bl.blockFormat());
    if (object && object->format().toListFormat().style() != QTextListFormat::ListStyleUndefined)
        drawListItem(offset, painter, context, bl, selFormat);

    QPen oldPen = painter->pen();
    painter->setPen(context.palette.color(QPalette::Text));

    tl->draw(painter, offset, selections, context.clip.isValid() ? (context.clip & clipRect) : clipRect);

    // if the block is empty and it precedes a table, do not draw the cursor.
    // the cursor is drawn later after the table has been drawn so no need
    // to draw it here.
    if (!isEmptyBlockBeforeTable(frameIteratorForTextPosition(blpos))
        && ((context.cursorPosition >= blpos && context.cursorPosition < blpos + bllen)
            || (context.cursorPosition < -1 && !tl->preeditAreaText().isEmpty()))) {
        int cpos = context.cursorPosition;
        if (cpos < -1)
            cpos = tl->preeditAreaPosition() - (cpos + 2);
        else
            cpos -= blpos;
        tl->drawCursor(painter, offset, cpos, cursorWidth);
    }

    if (blockFormat.hasProperty(QTextFormat::BlockTrailingHorizontalRulerWidth)) {
        const qreal width = blockFormat.lengthProperty(QTextFormat::BlockTrailingHorizontalRulerWidth).value(r.width());
        const auto color = blockFormat.hasProperty(QTextFormat::BackgroundBrush)
                         ? qvariant_cast<QBrush>(blockFormat.property(QTextFormat::BackgroundBrush)).color()
                         : context.palette.color(QPalette::Inactive, QPalette::WindowText);
        painter->setPen(color);
        qreal y = r.bottom();
        if (bl.length() == 1)
            y = r.top() + r.height() / 2;

        const qreal middleX = r.left() + r.width() / 2;
        painter->drawLine(QLineF(middleX - width / 2, y, middleX + width / 2, y));
    }

    painter->setPen(oldPen);
}